

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O3

char * PAL_fgets(char *sz,int nSize,PAL_FILE *pf)

{
  char *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (pf == (PAL_FILE *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = CorUnix::InternalFgets(sz,nSize,pf->bsdFilePtr,pf->bTextMode != 0);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return pcVar1;
    }
  }
  abort();
}

Assistant:

char *
__cdecl
PAL_fgets(
    char *sz,
    int nSize,
    PAL_FILE *pf
    )
{
    char * szBuf;

    PERF_ENTRY(fgets);
    ENTRY( "fgets(sz=%p (%s) nSize=%d pf=%p)\n", sz, sz, nSize, pf);

    if (pf != NULL)
    {
        szBuf = InternalFgets(sz, nSize, pf->bsdFilePtr, pf->bTextMode);
    }
    else
    {
        szBuf = NULL;
    }

    LOGEXIT("fgets() returns %p\n", szBuf);
    PERF_EXIT(fgets);

    return szBuf;
}